

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WLANOptimizer.cpp
# Opt level: O3

int OptimizeWLAN(int enable)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&APILock);
  if (iVar1 == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&APILock);
    return 4;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

int OptimizeWLAN(int enable)
{
    std::lock_guard<std::mutex> locker(APILock);

#ifdef _WIN32

    // If the handle has not been opened yet:
    if (!m_clientHandle)
    {
        const DWORD clientVersion = 2;
        DWORD negotiatedVersion = 0;
        const DWORD openResult = ::WlanOpenHandle(
            clientVersion,
            nullptr,
            &negotiatedVersion,
            &m_clientHandle);

        // If the handle could not be opened:
        if (openResult != ERROR_SUCCESS ||
            !m_clientHandle)
        {
            return OptimizeWLAN_Unavailable;
        }
    }

    OptimizeWLAN_Result result = OptimizeWLAN_NoConnections;

    WLAN_INTERFACE_INFO_LIST* infoListPtr = nullptr;
    const DWORD enumResult = ::WlanEnumInterfaces(
        m_clientHandle,
        nullptr,
        &infoListPtr);

    // If the enumeration call succeeded:
    if (enumResult == ERROR_SUCCESS && infoListPtr)
    {
        const int count = (int)infoListPtr->dwNumberOfItems;

        // For each item:
        for (int i = 0; i < count; ++i)
        {
            const WLAN_INTERFACE_INFO* info = &infoListPtr->InterfaceInfo[i];

            // In my testing I found that only connected WiFi adapters are able to change this setting,
            // as otherwise WlanSetInterface() returns ERROR_INVALID_STATE.
            if (info->isState != wlan_interface_state_connected) {
                continue;
            }

            OptimizeWLAN_Result setResult;

            setResult = SetWlanSetting(
                &info->InterfaceGuid,
                wlan_intf_opcode_media_streaming_mode,
                enable != 0);

            // For multiple WiFi adapters, we should overwrite any status
            // result that is less important.  For example, OptimizeWLAN_Preconfigured
            // should be replaced by OptimizeWLAN_Applied or an error code.
            if (result < setResult) {
                result = setResult;
            }

            setResult = SetWlanSetting(
                &info->InterfaceGuid,
                wlan_intf_opcode_background_scan_enabled,
                enable == 0);

            // Ditto
            if (result < setResult) {
                result = setResult;
            }
        } // For each enumerated WLAN interface
    } // End if enumeration succeeded

    // Free memory for the enumerated info list
    if (infoListPtr != nullptr) {
        ::WlanFreeMemory(infoListPtr);
    }

    // Leak handle intentionally here - When the app closes it will be released.
    //::WlanCloseHandle(m_clientHandle, nullptr);

    return result;

#else //_WIN32

    (void)enable; // Unused

    // TBD: Are there also correctable issues on Mac/Linux?
    return OptimizeWLAN_Unavailable;

#endif //_WIN32
}